

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp2::compute(Matrix<double,_10,_6,_0,_10,_6> *groebnerMatrix)

{
  sPolynomial5(groebnerMatrix);
  sPolynomial6(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,6);
  sPolynomial7(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,7);
  groebnerRow6_00_f(groebnerMatrix,7);
  sPolynomial8(groebnerMatrix);
  groebnerRow7_10_f(groebnerMatrix,8);
  groebnerRow6_00_f(groebnerMatrix,8);
  groebnerRow7_00_f(groebnerMatrix,8);
  sPolynomial9(groebnerMatrix);
  groebnerRow7_00_f(groebnerMatrix,9);
  groebnerRow8_00_f(groebnerMatrix,9);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::compute(
    Eigen::Matrix<double,10,6> & groebnerMatrix )
{
  sPolynomial5(groebnerMatrix);

  sPolynomial6(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_00_f(groebnerMatrix,7);
  groebnerRow6_00_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow7_10_f(groebnerMatrix,8);
  groebnerRow6_00_f(groebnerMatrix,8);
  groebnerRow7_00_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow7_00_f(groebnerMatrix,9);
  groebnerRow8_00_f(groebnerMatrix,9);

}